

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::constante(Sintatico *this)

{
  bool bVar1;
  Sintatico *this_local;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  if (bVar1) {
    identificador(this);
  }
  else {
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
    if (bVar1) {
      eat(this,7);
    }
    else {
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,8);
      if (bVar1) {
        eat(this,8);
      }
    }
    numero(this);
  }
  return;
}

Assistant:

void Sintatico::constante() {
  if (isEqual(tok, LETRA)) identificador();
  else {
    if (isEqual(tok, MAIS)) eat(MAIS);
    else if (isEqual(tok, MENOS)) eat(MENOS);
    numero();
  }
}